

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  long *plVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  BYTE *mEnd;
  BYTE *pBVar6;
  U32 *pUVar7;
  U32 *pUVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  U32 UVar12;
  uint uVar13;
  size_t sVar14;
  byte bVar15;
  uint uVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  uint uVar19;
  ulong uVar20;
  long *plVar21;
  uint uVar22;
  long lVar24;
  U32 UVar25;
  BYTE *iStart;
  BYTE *pBVar26;
  ulong uVar27;
  int *piVar28;
  U32 UVar29;
  long *plVar30;
  int iVar31;
  BYTE *base;
  U32 local_d4;
  ulong uVar23;
  
  uVar11 = (ms->cParams).targetLength;
  uVar11 = uVar11 + (uVar11 == 0);
  pBVar4 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar4 + uVar2;
  pZVar5 = ms->dictMatchState;
  uVar3 = (pZVar5->window).dictLimit;
  mEnd = (pZVar5->window).nextSrc;
  pBVar6 = (pZVar5->window).base;
  pBVar26 = pBVar6 + uVar3;
  uVar22 = ((int)pBVar6 - (int)mEnd) + uVar2;
  uVar23 = (ulong)uVar22;
  uVar13 = (ms->cParams).minMatch;
  pUVar7 = ms->hashTable;
  iEnd = (BYTE *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  pUVar8 = pZVar5->hashTable;
  plVar21 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar26) + (long)src);
  UVar25 = *rep;
  local_d4 = rep[1];
  iVar31 = (int)pBVar4;
  cVar9 = (char)(ms->cParams).hashLog;
  cVar10 = (char)(pZVar5->cParams).hashLog;
  if (uVar13 == 5) {
    bVar15 = 0x40 - cVar9;
LAB_00110163:
    if (plVar21 < plVar1) {
      lVar24 = *plVar21;
      uVar20 = (ulong)(lVar24 * -0x30e4432345000000) >> (bVar15 & 0x3f);
      uVar27 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar20];
      UVar29 = (U32)uVar27;
      uVar16 = (UVar29 - UVar25) + 1;
      pUVar7[uVar20] = UVar29;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_001101ca:
        if (uVar2 < uVar13) {
          piVar28 = (int *)(pBVar4 + uVar13);
          if (*piVar28 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar28;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar28 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)(lVar24 + (long)piVar28) && (src < plVar30)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar28 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_00110322:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_d4 = UVar25;
            goto LAB_00110352;
          }
        }
        else {
          uVar13 = pUVar8[(ulong)(lVar24 * -0x30e4432345000000) >> (0x40U - cVar10 & 0x3f)];
          uVar20 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar20) == (int)*plVar21)) {
            UVar12 = (UVar29 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar20 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21), pBVar26 < pBVar6 + lVar24 + uVar20 &&
                 (src < plVar30)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar20 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_00110322;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      else {
        piVar28 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar28 != *(int *)((long)plVar21 + 1)) goto LAB_001101ca;
        plVar30 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar25;
LAB_00110352:
        UVar25 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar30);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(ulong)(*(long *)(pBVar4 + (uVar27 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                 (bVar15 & 0x3f)] = UVar29 + 2;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar15 & 0x3f)] =
               ((int)src + -2) - iVar31;
          UVar29 = UVar25;
          for (; UVar25 = UVar29, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar29 = (int)src - iVar31;
            uVar13 = UVar29 - local_d4;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if (((uVar2 - 1) - uVar13 < 3) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(ulong)(*src * -0x30e4432345000000) >> (bVar15 & 0x3f)] = UVar29;
            UVar29 = local_d4;
            local_d4 = UVar25;
          }
        }
      }
      goto LAB_00110163;
    }
  }
  else if (uVar13 == 6) {
    bVar15 = 0x40 - cVar9;
LAB_0010fdfb:
    if (plVar21 < plVar1) {
      lVar24 = *plVar21;
      uVar20 = (ulong)(lVar24 * -0x30e4432340650000) >> (bVar15 & 0x3f);
      uVar27 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar20];
      UVar29 = (U32)uVar27;
      uVar16 = (UVar29 - UVar25) + 1;
      pUVar7[uVar20] = UVar29;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_0010fe5a:
        if (uVar2 < uVar13) {
          piVar28 = (int *)(pBVar4 + uVar13);
          if (*piVar28 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar28;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar28 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)(lVar24 + (long)piVar28) && (src < plVar30)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar28 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_0010ffb5:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_d4 = UVar25;
            goto LAB_0010ffe5;
          }
        }
        else {
          uVar13 = pUVar8[(ulong)(lVar24 * -0x30e4432340650000) >> (0x40U - cVar10 & 0x3f)];
          uVar20 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar20) == (int)*plVar21)) {
            UVar12 = (UVar29 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar20 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21), pBVar26 < pBVar6 + lVar24 + uVar20 &&
                 (src < plVar30)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar20 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_0010ffb5;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      else {
        piVar28 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar28 != *(int *)((long)plVar21 + 1)) goto LAB_0010fe5a;
        plVar30 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar25;
LAB_0010ffe5:
        UVar25 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar30);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(ulong)(*(long *)(pBVar4 + (uVar27 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                 (bVar15 & 0x3f)] = UVar29 + 2;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar15 & 0x3f)] =
               ((int)src + -2) - iVar31;
          UVar29 = UVar25;
          for (; UVar25 = UVar29, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar29 = (int)src - iVar31;
            uVar13 = UVar29 - local_d4;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if (((uVar2 - 1) - uVar13 < 3) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(ulong)(*src * -0x30e4432340650000) >> (bVar15 & 0x3f)] = UVar29;
            UVar29 = local_d4;
            local_d4 = UVar25;
          }
        }
      }
      goto LAB_0010fdfb;
    }
  }
  else if (uVar13 == 7) {
    bVar15 = 0x40 - cVar9;
LAB_0010fa7b:
    if (plVar21 < plVar1) {
      lVar24 = *plVar21;
      uVar20 = (ulong)(lVar24 * -0x30e44323405a9d00) >> (bVar15 & 0x3f);
      uVar27 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar20];
      UVar29 = (U32)uVar27;
      uVar16 = (UVar29 - UVar25) + 1;
      pUVar7[uVar20] = UVar29;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_0010fada:
        if (uVar2 < uVar13) {
          piVar28 = (int *)(pBVar4 + uVar13);
          if (*piVar28 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar28;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar28 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)(lVar24 + (long)piVar28) && (src < plVar30)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar28 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_0010fc35:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_d4 = UVar25;
            goto LAB_0010fc65;
          }
        }
        else {
          uVar13 = pUVar8[(ulong)(lVar24 * -0x30e44323405a9d00) >> (0x40U - cVar10 & 0x3f)];
          uVar20 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar20) == (int)*plVar21)) {
            UVar12 = (UVar29 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar20 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21), pBVar26 < pBVar6 + lVar24 + uVar20 &&
                 (src < plVar30)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar20 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_0010fc35;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      else {
        piVar28 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar28 != *(int *)((long)plVar21 + 1)) goto LAB_0010fada;
        plVar30 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar25;
LAB_0010fc65:
        UVar25 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar30);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(ulong)(*(long *)(pBVar4 + (uVar27 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                 (bVar15 & 0x3f)] = UVar29 + 2;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] =
               ((int)src + -2) - iVar31;
          UVar29 = UVar25;
          for (; UVar25 = UVar29, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar29 = (int)src - iVar31;
            uVar13 = UVar29 - local_d4;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if (((uVar2 - 1) - uVar13 < 3) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(ulong)(*src * -0x30e44323405a9d00) >> (bVar15 & 0x3f)] = UVar29;
            UVar29 = local_d4;
            local_d4 = UVar25;
          }
        }
      }
      goto LAB_0010fa7b;
    }
  }
  else {
    bVar15 = 0x20 - cVar9;
LAB_001104dd:
    if (plVar21 < plVar1) {
      uVar19 = (uint)((int)*plVar21 * -0x61c8864f) >> (bVar15 & 0x1f);
      uVar20 = (long)plVar21 - (long)pBVar4;
      uVar13 = pUVar7[uVar19];
      UVar29 = (U32)uVar20;
      uVar16 = (UVar29 - UVar25) + 1;
      pUVar7[uVar19] = UVar29;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_00110534:
        if (uVar2 < uVar13) {
          piVar28 = (int *)(pBVar4 + uVar13);
          if (*piVar28 == (int)*plVar21) {
            UVar12 = (int)plVar21 - (int)piVar28;
            sVar14 = ZSTD_count((BYTE *)((long)plVar21 + 4),(BYTE *)(piVar28 + 1),iEnd);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21),
                 iStart < (BYTE *)(lVar24 + (long)piVar28) && (src < plVar30)) &&
                (*(char *)((long)plVar21 + lVar24 + -1) == *(char *)((long)piVar28 + lVar24 + -1)));
                lVar24 = lVar24 + -1) {
            }
LAB_00110690:
            sVar14 = sVar14 - lVar24;
            ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,UVar12 + 2,sVar14 + 1);
            local_d4 = UVar25;
            goto LAB_001106c0;
          }
        }
        else {
          uVar13 = pUVar8[(uint)((int)*plVar21 * -0x61c8864f) >> (0x20U - cVar10 & 0x1f)];
          uVar27 = (ulong)uVar13;
          if ((uVar3 < uVar13) && (*(int *)(pBVar6 + uVar27) == (int)*plVar21)) {
            UVar12 = (UVar29 - uVar22) - uVar13;
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar21 + 4),pBVar6 + uVar27 + 4,iEnd,mEnd,iStart);
            for (lVar24 = 0;
                ((plVar30 = (long *)(lVar24 + (long)plVar21), pBVar26 < pBVar6 + lVar24 + uVar27 &&
                 (src < plVar30)) &&
                (*(BYTE *)((long)plVar21 + lVar24 + -1) == pBVar6[lVar24 + (uVar27 - 1)]));
                lVar24 = lVar24 + -1) {
            }
            goto LAB_00110690;
          }
        }
        plVar21 = (long *)((long)plVar21 + ((long)plVar21 - (long)src >> 8) + (ulong)uVar11);
      }
      else {
        piVar28 = (int *)(pBVar4 + uVar16);
        if (uVar16 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar16 - uVar22));
        }
        if (*piVar28 != *(int *)((long)plVar21 + 1)) goto LAB_00110534;
        plVar30 = (long *)((long)plVar21 + 1);
        pBVar17 = iEnd;
        if (uVar16 < uVar2) {
          pBVar17 = mEnd;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar21 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar17,iStart);
        ZSTD_storeSeq(seqStore,(long)plVar30 - (long)src,src,0,sVar14 + 1);
        UVar12 = UVar25;
LAB_001106c0:
        UVar25 = UVar12;
        src = (void *)(sVar14 + 4 + (long)plVar30);
        plVar21 = (long *)src;
        if (src <= plVar1) {
          pUVar7[(uint)(*(int *)(pBVar4 + (uVar20 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar15 & 0x1f)] = UVar29 + 2;
          pUVar7[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar15 & 0x1f)] =
               ((int)src + -2) - iVar31;
          UVar29 = UVar25;
          for (; UVar25 = UVar29, plVar21 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar14 + 4)) {
            UVar29 = (int)src - iVar31;
            uVar13 = UVar29 - local_d4;
            pBVar17 = pBVar4;
            if (uVar13 < uVar2) {
              pBVar17 = pBVar6 + -uVar23;
            }
            if (((uVar2 - 1) - uVar13 < 3) || (*(int *)(pBVar17 + uVar13) != (int)*src)) break;
            pBVar18 = iEnd;
            if (uVar13 < uVar2) {
              pBVar18 = mEnd;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar13) + 4),iEnd,
                                pBVar18,iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar14 + 1);
            pUVar7[(uint)((int)*src * -0x61c8864f) >> (bVar15 & 0x1f)] = UVar29;
            UVar29 = local_d4;
            local_d4 = UVar25;
          }
        }
      }
      goto LAB_001104dd;
    }
  }
  *rep = UVar25;
  rep[1] = local_d4;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}